

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O2

int exception_increment_reference(exception ex)

{
  int iVar1;
  
  iVar1 = 1;
  if ((ex != (exception)0x0) && ((ex->ref).count != 0xffffffffffffffff)) {
    LOCK();
    (ex->ref).count = (ex->ref).count + 1;
    UNLOCK();
    LOCK();
    exception_stats.increments = exception_stats.increments + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int exception_increment_reference(exception ex)
{
	if (ex == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_increment(&ex->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_increment(exception_stats);

	return 0;
}